

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_compareCString_firstLessThanSecond_fn(int _i)

{
  uint uVar1;
  char *pcVar2;
  char *expr;
  int line;
  char *pcVar3;
  char *pcVar4;
  AString string2;
  AString string3;
  AString string1;
  
  private_ACUtilsTest_AString_constructTestString(&string1,"",8);
  private_ACUtilsTest_AString_constructTestString(&string2,"a",8);
  private_ACUtilsTest_AString_constructTestString(&string3,"b",8);
  private_ACUtilsTest_AString_reallocFail = 0;
  uVar1 = AString_compareCString(&string1,"a");
  if (-1 < (int)uVar1) {
    string1.size = (size_t)uVar1;
    string3.buffer = "0";
    expr = "Assertion \'_ck_x < _ck_y\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
    pcVar3 = "AString_compareCString(&string1, \"a\") < 0";
    pcVar4 = "AString_compareCString(&string1, \"a\")";
    line = 0x925;
    goto LAB_0014b3bc;
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x925);
  if (string1.capacity == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x926);
    if (string1.buffer == (char *)0x0) {
      string1.size = 0;
      string3.buffer = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar2 = "Assertion \'%s\' failed: %s == %#x";
      pcVar3 = "(void*) (string1).buffer != NULL";
      pcVar4 = "(void*) (string1).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x926);
      if (string1.buffer == (char *)0x0) {
        string1.buffer = "(null)";
        string1.size = 0x16819b;
      }
      else {
        if (*string1.buffer == '\0') {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x926);
          if (string1.size != 0) {
            string3.buffer = "strlen(\"\")";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar3 = "(string1).size == strlen(\"\")";
            pcVar4 = "(string1).size";
            goto LAB_0014ae77;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x926);
          if (private_ACUtilsTest_AString_reallocCount != 0) {
            string3.buffer = "(0)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar3 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar4 = "private_ACUtilsTest_AString_reallocCount";
            line = 0x927;
            string1.size = private_ACUtilsTest_AString_reallocCount;
            goto LAB_0014b3bc;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x927);
          uVar1 = AString_compareCString(&string2,"b");
          if (-1 < (int)uVar1) {
            string3.buffer = "0";
            expr = "Assertion \'_ck_x < _ck_y\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
            pcVar3 = "AString_compareCString(&string2, \"b\") < 0";
            pcVar4 = "AString_compareCString(&string2, \"b\")";
            line = 0x928;
            string1.size = (size_t)(ulong)uVar1;
            goto LAB_0014b3bc;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x928);
          if (string2.capacity == 8) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x929);
            if (string2.buffer == (char *)0x0) {
              string2.size = 0;
              string3.buffer = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar2 = "Assertion \'%s\' failed: %s == %#x";
              pcVar3 = "(void*) (string2).buffer != NULL";
              pcVar4 = "(void*) (string2).buffer";
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x929);
              if (string2.buffer == (char *)0x0) {
                string2.size = 0x16819b;
                string2.buffer = "(null)";
              }
              else {
                uVar1 = (byte)*string2.buffer - 0x61;
                if (uVar1 == 0) {
                  uVar1 = (uint)(byte)string2.buffer[1];
                }
                if (uVar1 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x929);
                  if (string2.size != 1) {
                    string3.buffer = "strlen(\"a\")";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar3 = "(string2).size == strlen(\"a\")";
                    pcVar4 = "(string2).size";
                    goto LAB_0014b037;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x929);
                  if (private_ACUtilsTest_AString_reallocCount != 0) {
                    string3.buffer = "(0)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar3 = "private_ACUtilsTest_AString_reallocCount == (0)";
                    pcVar4 = "private_ACUtilsTest_AString_reallocCount";
                    line = 0x92a;
                    string1.size = private_ACUtilsTest_AString_reallocCount;
                    goto LAB_0014b3bc;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x92a);
                  uVar1 = AString_compareCString(&string2,"ba");
                  if (-1 < (int)uVar1) {
                    string3.buffer = "0";
                    expr = "Assertion \'_ck_x < _ck_y\' failed";
                    pcVar2 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
                    pcVar3 = "AString_compareCString(&string2, \"ba\") < 0";
                    pcVar4 = "AString_compareCString(&string2, \"ba\")";
                    line = 0x92b;
                    string1.size = (size_t)(ulong)uVar1;
                    goto LAB_0014b3bc;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x92b);
                  if (string2.capacity == 8) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x92c);
                    if (string2.buffer == (char *)0x0) {
                      string2.size = 0;
                      string3.buffer = (char *)0x0;
                      expr = "Assertion \'_ck_x != NULL\' failed";
                      pcVar2 = "Assertion \'%s\' failed: %s == %#x";
                      pcVar3 = "(void*) (string2).buffer != NULL";
                      pcVar4 = "(void*) (string2).buffer";
                    }
                    else {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x92c);
                      if (string2.buffer == (char *)0x0) {
                        string2.size = 0x16819b;
                        string2.buffer = "(null)";
                      }
                      else {
                        uVar1 = (byte)*string2.buffer - 0x61;
                        if (uVar1 == 0) {
                          uVar1 = (uint)(byte)string2.buffer[1];
                        }
                        if (uVar1 == 0) {
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x92c);
                          if (string2.size != 1) {
                            string3.buffer = "strlen(\"a\")";
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar3 = "(string2).size == strlen(\"a\")";
                            pcVar4 = "(string2).size";
                            goto LAB_0014b1f7;
                          }
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x92c);
                          if (private_ACUtilsTest_AString_reallocCount != 0) {
                            string3.buffer = "(0)";
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar3 = "private_ACUtilsTest_AString_reallocCount == (0)";
                            pcVar4 = "private_ACUtilsTest_AString_reallocCount";
                            line = 0x92d;
                            string1.size = private_ACUtilsTest_AString_reallocCount;
                            goto LAB_0014b3bc;
                          }
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x92d);
                          uVar1 = AString_compareCString(&string3,"ba");
                          if (-1 < (int)uVar1) {
                            string3.buffer = "0";
                            expr = "Assertion \'_ck_x < _ck_y\' failed";
                            pcVar2 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
                            pcVar3 = "AString_compareCString(&string3, \"ba\") < 0";
                            pcVar4 = "AString_compareCString(&string3, \"ba\")";
                            line = 0x92e;
                            string1.size = (size_t)(ulong)uVar1;
                            goto LAB_0014b3bc;
                          }
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x92e);
                          if (string3.capacity == 8) {
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0x92f);
                            if (string3.buffer == (char *)0x0) {
                              string3.size = 0;
                              string3.buffer = (char *)0x0;
                              expr = "Assertion \'_ck_x != NULL\' failed";
                              pcVar2 = "Assertion \'%s\' failed: %s == %#x";
                              pcVar3 = "(void*) (string3).buffer != NULL";
                              pcVar4 = "(void*) (string3).buffer";
                            }
                            else {
                              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0x92f);
                              if (string3.buffer == (char *)0x0) {
                                string3.buffer = "(null)";
                                string3.size = 0x16819b;
                              }
                              else {
                                uVar1 = (byte)*string3.buffer - 0x62;
                                if (uVar1 == 0) {
                                  uVar1 = (uint)(byte)string3.buffer[1];
                                }
                                if (uVar1 == 0) {
                                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x92f);
                                  if (string3.size == 1) {
                                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                ,0x92f);
                                    if (private_ACUtilsTest_AString_reallocCount == 0) {
                                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x930);
                                      (*string1.deallocator)(string1.buffer);
                                      (*string2.deallocator)(string2.buffer);
                                      (*string3.deallocator)(string3.buffer);
                                      return;
                                    }
                                    string3.buffer = "(0)";
                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                    pcVar3 = "private_ACUtilsTest_AString_reallocCount == (0)";
                                    pcVar4 = "private_ACUtilsTest_AString_reallocCount";
                                    line = 0x930;
                                    string1.size = private_ACUtilsTest_AString_reallocCount;
                                    goto LAB_0014b3bc;
                                  }
                                  string3.buffer = "strlen(\"b\")";
                                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                                  pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                  pcVar3 = "(string3).size == strlen(\"b\")";
                                  pcVar4 = "(string3).size";
                                  goto LAB_0014b3b7;
                                }
                                string3.size = 0x15c553;
                              }
                              expr = 
                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                              ;
                              pcVar2 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                              pcVar3 = "(string3).buffer == (\"b\")";
                              pcVar4 = "(string3).buffer";
                            }
                          }
                          else {
                            string3.buffer = "(8)";
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar3 = "(string3).capacity == (8)";
                            pcVar4 = "(string3).capacity";
                            string3.size = string3.capacity;
                          }
LAB_0014b3b7:
                          line = 0x92f;
                          string1.size = string3.size;
                          goto LAB_0014b3bc;
                        }
                        string2.size = 0x15c553;
                      }
                      expr = 
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ;
                      pcVar2 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                      pcVar3 = "(string2).buffer == (\"a\")";
                      pcVar4 = "(string2).buffer";
                      string3.buffer = string2.buffer;
                    }
                  }
                  else {
                    string3.buffer = "(8)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar3 = "(string2).capacity == (8)";
                    pcVar4 = "(string2).capacity";
                    string2.size = string2.capacity;
                  }
LAB_0014b1f7:
                  line = 0x92c;
                  string1.size = string2.size;
                  goto LAB_0014b3bc;
                }
                string2.size = 0x15c553;
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar2 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar3 = "(string2).buffer == (\"a\")";
              pcVar4 = "(string2).buffer";
              string3.buffer = string2.buffer;
            }
          }
          else {
            string3.buffer = "(8)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar3 = "(string2).capacity == (8)";
            pcVar4 = "(string2).capacity";
            string2.size = string2.capacity;
          }
LAB_0014b037:
          line = 0x929;
          string1.size = string2.size;
          goto LAB_0014b3bc;
        }
        string1.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar2 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar3 = "(string1).buffer == (\"\")";
      pcVar4 = "(string1).buffer";
      string3.buffer = string1.buffer;
    }
  }
  else {
    string3.buffer = "(8)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar3 = "(string1).capacity == (8)";
    pcVar4 = "(string1).capacity";
    string1.size = string1.capacity;
  }
LAB_0014ae77:
  line = 0x926;
LAB_0014b3bc:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,line,expr,pcVar2,pcVar3,pcVar4,string1.size,string3.buffer);
}

Assistant:

END_TEST
START_TEST(test_AString_compareCString_firstLessThanSecond)
{
    struct AString string1 = private_ACUtilsTest_AString_constructTestString("", 8);
    struct AString string2 = private_ACUtilsTest_AString_constructTestString("a", 8);
    struct AString string3 = private_ACUtilsTest_AString_constructTestString("b", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT_INT_LT(AString_compareCString(&string1, "a"), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string1, "", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_INT_LT(AString_compareCString(&string2, "b"), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string2, "a", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_INT_LT(AString_compareCString(&string2, "ba"), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string2, "a", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_INT_LT(AString_compareCString(&string3, "ba"), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string3, "b", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string1);
    private_ACUtilsTest_AString_destructTestString(string2);
    private_ACUtilsTest_AString_destructTestString(string3);
}